

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_matchers_impl.hpp
# Opt level: O2

void __thiscall
Catch::MatchExpr<slang::SVInt_&,_SVIntExactlyEqualMatcher>::streamReconstructedExpression
          (MatchExpr<slang::SVInt_&,_SVIntExactlyEqualMatcher> *this,ostream *os)

{
  ostream *poVar1;
  string sStack_58;
  enable_if_t<_::Catch::Detail::IsStreamInsertable<SVInt>::value,_std::string> local_38;
  
  StringMaker<slang::SVInt,_void>::convert<slang::SVInt>(&local_38,this->m_arg);
  poVar1 = std::operator<<(os,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,' ');
  Matchers::MatcherUntypedBase::toString_abi_cxx11_
            (&sStack_58,(MatcherUntypedBase *)this->m_matcher);
  std::operator<<(poVar1,(string *)&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream& os ) const override {
            os << Catch::Detail::stringify( m_arg )
               << ' '
               << m_matcher.toString();
        }